

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O1

void secp256k1_scalar_inverse(secp256k1_scalar *r,secp256k1_scalar *x)

{
  uchar *key;
  secp256k1_scalar sVar1;
  secp256k1_scalar sVar2;
  int iVar3;
  size_t keylen;
  size_t keylen_00;
  size_t keylen_01;
  size_t keylen_02;
  uint uVar4;
  uchar *data;
  uchar *data_00;
  secp256k1_hmac_sha256 sStack_110;
  secp256k1_scalar *psStack_40;
  
  secp256k1_scalar_verify(x);
  sVar1 = *x;
  iVar3 = sVar1 + 1;
  data = (uchar *)(ulong)-sVar1;
  sVar2 = 0;
  do {
    iVar3 = iVar3 - sVar1;
    uVar4 = (int)data + sVar1;
    data = (uchar *)(ulong)uVar4;
    uVar4 = uVar4 / 0xd + (uVar4 / 0xd) * 0xc + iVar3;
    data_00 = (uchar *)(ulong)uVar4;
    if (uVar4 == 0) goto LAB_0011661e;
    sVar2 = sVar2 + 1;
  } while (sVar2 != 0xd);
  sVar2 = 0;
LAB_0011661e:
  if (sVar2 != 0) {
    *r = sVar2;
    secp256k1_scalar_verify(r);
    return;
  }
  secp256k1_scalar_inverse_cold_1();
  builtin_memcpy(data_00,
                 "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                 ,0x21);
  key = data_00 + 0x20;
  data_00[0x21] = '\0';
  data_00[0x22] = '\0';
  data_00[0x23] = '\0';
  data_00[0x24] = '\0';
  data_00[0x25] = '\0';
  data_00[0x26] = '\0';
  data_00[0x27] = '\0';
  data_00[0x28] = '\0';
  data_00[0x29] = '\0';
  data_00[0x2a] = '\0';
  data_00[0x2b] = '\0';
  data_00[0x2c] = '\0';
  data_00[0x2d] = '\0';
  data_00[0x2e] = '\0';
  data_00[0x2f] = '\0';
  data_00[0x30] = '\0';
  data_00[0x31] = '\0';
  data_00[0x32] = '\0';
  data_00[0x33] = '\0';
  data_00[0x34] = '\0';
  data_00[0x35] = '\0';
  data_00[0x36] = '\0';
  data_00[0x37] = '\0';
  data_00[0x38] = '\0';
  data_00[0x39] = '\0';
  data_00[0x3a] = '\0';
  data_00[0x3b] = '\0';
  data_00[0x3c] = '\0';
  data_00[0x3d] = '\0';
  data_00[0x3e] = '\0';
  data_00[0x3f] = '\0';
  psStack_40 = r;
  secp256k1_hmac_sha256_initialize(&sStack_110,key,keylen);
  secp256k1_sha256_write(&sStack_110.inner,data_00,0x20);
  secp256k1_sha256_write(&sStack_110.inner,"",1);
  secp256k1_sha256_write(&sStack_110.inner,data,keylen);
  secp256k1_hmac_sha256_finalize(&sStack_110,key);
  secp256k1_hmac_sha256_initialize(&sStack_110,key,keylen_00);
  secp256k1_sha256_write(&sStack_110.inner,data_00,0x20);
  secp256k1_hmac_sha256_finalize(&sStack_110,data_00);
  secp256k1_hmac_sha256_initialize(&sStack_110,key,keylen_01);
  secp256k1_sha256_write(&sStack_110.inner,data_00,0x20);
  secp256k1_sha256_write(&sStack_110.inner,"\x01",1);
  secp256k1_sha256_write(&sStack_110.inner,data,keylen);
  secp256k1_hmac_sha256_finalize(&sStack_110,key);
  secp256k1_hmac_sha256_initialize(&sStack_110,key,keylen_02);
  secp256k1_sha256_write(&sStack_110.inner,data_00,0x20);
  secp256k1_hmac_sha256_finalize(&sStack_110,data_00);
  data_00[0x40] = '\0';
  data_00[0x41] = '\0';
  data_00[0x42] = '\0';
  data_00[0x43] = '\0';
  return;
}

Assistant:

static void secp256k1_scalar_inverse(secp256k1_scalar *r, const secp256k1_scalar *x) {
    int i;
    uint32_t res = 0;
    SECP256K1_SCALAR_VERIFY(x);

    for (i = 0; i < EXHAUSTIVE_TEST_ORDER; i++) {
        if ((i * *x) % EXHAUSTIVE_TEST_ORDER == 1) {
            res = i;
            break;
        }
    }

    /* If this VERIFY_CHECK triggers we were given a noninvertible scalar (and thus
     * have a composite group order; fix it in exhaustive_tests.c). */
    VERIFY_CHECK(res != 0);
    *r = res;

    SECP256K1_SCALAR_VERIFY(r);
}